

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall
BpTree<float>::Coalesce(BpTree<float> *this,IndexNode<float> *C,IndexNode<float> *D,float k2)

{
  vector<char,_std::allocator<char>_> *__x;
  vector<Addr,_std::allocator<Addr>_> *__x_00;
  vector<float,_std::allocator<float>_> *__x_01;
  vector<char,_std::allocator<char>_> *__x_02;
  vector<Addr,_std::allocator<Addr>_> *__x_03;
  int iVar1;
  pointer pAVar2;
  Addr p;
  long lVar3;
  char cVar4;
  int iVar5;
  pointer __dest;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  vector<float,_std::allocator<float>_> *__x_04;
  long lVar9;
  size_t __n;
  IndexNode<float> E;
  IndexNode<float> P;
  IndexNode<float> local_330;
  IndexNode<float> local_2d0;
  char local_270;
  vector<float,_std::allocator<float>_> local_268;
  vector<char,_std::allocator<char>_> local_250;
  vector<Addr,_std::allocator<Addr>_> local_238;
  Addr local_220;
  Addr AStack_218;
  char local_210;
  vector<float,_std::allocator<float>_> local_208;
  vector<char,_std::allocator<char>_> local_1f0;
  vector<Addr,_std::allocator<Addr>_> local_1d8;
  Addr local_1c0;
  Addr AStack_1b8;
  IndexNode<float> local_1b0;
  IndexNode<float> local_150;
  char local_f0;
  vector<float,_std::allocator<float>_> local_e8;
  vector<char,_std::allocator<char>_> local_d0;
  vector<Addr,_std::allocator<Addr>_> local_b8;
  Addr local_a0;
  Addr AStack_98;
  IndexNode<float> local_90;
  
  local_210 = C->NodeState;
  __x_04 = &C->k;
  std::vector<float,_std::allocator<float>_>::vector(&local_208,__x_04);
  __x = &C->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_1f0,__x);
  __x_00 = &C->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1d8,__x_00);
  local_1c0 = C->parent;
  AStack_1b8 = C->self;
  Buffer::Lock(&blocks,AStack_1b8.BlockNum);
  if (local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_270 = D->NodeState;
  __x_01 = &D->k;
  std::vector<float,_std::allocator<float>_>::vector(&local_268,__x_01);
  __x_02 = &D->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_250,__x_02);
  __x_03 = &D->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_238,__x_03);
  local_220 = D->parent;
  AStack_218 = D->self;
  Buffer::Lock(&blocks,AStack_218.BlockNum);
  if (local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  IndexNode<float>::IndexNode(&local_330,this->N);
  IndexNode<float>::IndexNode(&local_90,this->N);
  local_f0 = C->NodeState;
  std::vector<float,_std::allocator<float>_>::vector(&local_e8,__x_04);
  std::vector<char,_std::allocator<char>_>::vector(&local_d0,__x);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_b8,__x_00);
  cVar4 = local_f0;
  local_a0 = C->parent;
  AStack_98 = C->self;
  if (local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar1 = this->N;
  uVar6 = iVar1 - 1;
  if (cVar4 == '1') {
    if (iVar1 < 2) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        if ((__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar8] != '1') {
          uVar6 = (uint)uVar8;
          break;
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      uVar8 = (ulong)uVar6;
    }
    if (*(__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start == '1') {
      lVar7 = 0;
      do {
        (__x_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar8 + lVar7] =
             (__x_04->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar7];
        (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar8 + lVar7] =
             (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar7];
        (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar7 + uVar8] =
             (__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar7];
        lVar9 = lVar7 + 1;
        lVar7 = lVar7 + 1;
      } while ((__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar9] == '1');
    }
    (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
    _M_start[(long)this->N + -1] =
         (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
         _M_start[(long)this->N + -1];
  }
  else {
    iVar5 = 0;
    uVar8 = 0;
    if (1 < iVar1) {
      uVar8 = 0;
      do {
        if ((__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar8] != '1') goto LAB_0013b5ac;
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      uVar8 = (ulong)uVar6;
    }
LAB_0013b5ac:
    uVar8 = uVar8 & 0xffffffff;
    (__x_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar8] = k2;
    (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar8] = '1';
    lVar7 = uVar8 + 1;
    if (*(__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start == '1') {
      lVar9 = 0;
      do {
        (__x_01->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar7 + lVar9] =
             (__x_04->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar9];
        (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar7 + lVar9] =
             (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar9];
        (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar9 + lVar7] =
             (__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar9];
        lVar3 = lVar9 + 1;
        lVar9 = lVar9 + 1;
      } while ((__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar3] == '1');
      iVar5 = (int)lVar9;
    }
    else {
      lVar9 = 0;
    }
    (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
    _M_start[(uint)(iVar5 + (int)lVar7)] =
         (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
         _M_start[lVar9];
    if (0 < this->N) {
      lVar7 = 0;
      do {
        pAVar2 = (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pAVar2[lVar7].FileOff == -1) break;
        FindNode(this,pAVar2[lVar7],&local_330);
        local_330.parent = D->self;
        local_2d0.NodeState = local_330.NodeState;
        std::vector<float,_std::allocator<float>_>::vector(&local_2d0.k,&local_330.k);
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar8 = (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        if (uVar8 == 0) {
          __dest = (pointer)0x0;
        }
        else {
          if ((long)uVar8 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (pointer)operator_new(uVar8);
        }
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = __dest + uVar8;
        __n = (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = __dest;
        if (__n != 0) {
          local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = __dest;
          memmove(__dest,local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,__n);
        }
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = __dest + __n;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_2d0.p,&local_330.p);
        local_2d0.parent = local_330.parent;
        local_2d0.self = local_330.self;
        UpdateBlock(this,&local_2d0);
        if (local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_2d0.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2d0.k.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_2d0.k.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < this->N);
    }
  }
  local_150.NodeState = C->NodeState;
  std::vector<float,_std::allocator<float>_>::vector(&local_150.k,__x_04);
  std::vector<char,_std::allocator<char>_>::vector(&local_150.v,__x);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_150.p,__x_00);
  local_150.parent = C->parent;
  local_150.self = C->self;
  UpdateBlock(this,&local_150);
  if (local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_1b0.NodeState = D->NodeState;
  std::vector<float,_std::allocator<float>_>::vector(&local_1b0.k,__x_01);
  std::vector<char,_std::allocator<char>_>::vector(&local_1b0.v,__x_02);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1b0.p,__x_03);
  local_1b0.parent = D->parent;
  local_1b0.self = D->self;
  UpdateBlock(this,&local_1b0);
  if (local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  p = C->self;
  FindNode(this,C->parent,&local_90);
  Delete_Aux(this,&local_90,k2,C->self);
  FindNode(this,p,&local_330);
  DeleteNode(this,&local_330);
  if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_330.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_330.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_330.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_330.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BpTree<K>::Coalesce(IndexNode<K>& C, IndexNode<K>& D, K k2) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> E(N);
	IndexNode<K> P(N);
	int m, pos;
	if (!this->IsLeaf(C)) {
		//��Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos+1]�ǿյ�
		D.k[pos] = k2;
		D.v[pos] = '1';
		pos++;
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[pos + m] = C.p[m];
		for (m = 0; m < N && C.p[m].FileOff != -1; m++) {
			this->FindNode(C.p[m], E);
			E.parent = D.self;
			this->UpdateBlock(E);
		}
	}
	else {
		//Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos]�ǿյ�
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[N - 1] = C.p[N - 1];
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	Addr temp_p = C.self;
	this->FindNode(C.parent, P);
	this->Delete_Aux(P, k2, C.self);
	this->FindNode(temp_p, E);
	this->DeleteNode(E);
	return;
}